

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void block_expr(Vm *vm)

{
  Compiler *pCVar1;
  uint32_t *puVar2;
  TokenType TVar3;
  CallFrame *pCVar4;
  uint64_t uVar5;
  char *pcVar6;
  size_t sVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  Token local_40;
  
  primary(vm);
  if ((vm->compiler).previous.type != TOKEN_CLOSE_BRACE) {
    uVar11 = (vm->compiler).scope_depth + 1;
    (vm->compiler).scope_depth = uVar11;
    var_ht_init((vm->compiler).scope + uVar11,8);
    while ((TVar3 = (vm->compiler).token.type, TVar3 != TOKEN_CLOSE_BRACE && (TVar3 != TOKEN_EOF)))
    {
      stmt(vm);
    }
    pCVar1 = &vm->compiler;
    pCVar4 = (vm->frames).frame_pointers[vm->frame_count - 1];
    uVar5 = (pCVar4->code_buffer).count;
    if ((pCVar4->code_buffer).code[uVar5 - 1] == '\x1b') {
      (pCVar4->code_buffer).count = uVar5 - 1;
    }
    uVar11 = (vm->compiler).scope_depth;
    puVar2 = &(vm->compiler).vars_in_scope;
    *puVar2 = *puVar2 - (vm->compiler).scope[uVar11].size;
    var_ht_free((vm->compiler).scope + uVar11);
    puVar2 = &(vm->compiler).scope_depth;
    *puVar2 = *puVar2 - 1;
    TVar3 = (pCVar1->token).type;
    uVar10 = *(undefined4 *)&(pCVar1->token).field_0x4;
    pcVar6 = (vm->compiler).token.start;
    uVar8 = (vm->compiler).token.line;
    uVar9 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
    (vm->compiler).previous.length = (vm->compiler).token.length;
    (vm->compiler).previous.line = uVar8;
    *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar9;
    (vm->compiler).previous.type = TVar3;
    *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar10;
    (vm->compiler).previous.start = pcVar6;
    uVar9 = *(undefined4 *)&(vm->compiler).next.field_0x4;
    pcVar6 = (vm->compiler).next.start;
    sVar7 = (vm->compiler).next.length;
    uVar8 = (vm->compiler).next.line;
    uVar10 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
    (pCVar1->token).type = (vm->compiler).next.type;
    *(undefined4 *)&(pCVar1->token).field_0x4 = uVar9;
    (vm->compiler).token.start = pcVar6;
    (vm->compiler).token.length = sVar7;
    (vm->compiler).token.line = uVar8;
    *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar10;
    scan_token(&local_40,&(vm->compiler).scanner);
    (vm->compiler).next.length = local_40.length;
    (vm->compiler).next.line = local_40.line;
    *(undefined4 *)&(vm->compiler).next.field_0x1c = local_40._28_4_;
    (vm->compiler).next.type = local_40.type;
    *(undefined4 *)&(vm->compiler).next.field_0x4 = local_40._4_4_;
    (vm->compiler).next.start = local_40.start;
  }
  return;
}

Assistant:

static void block_expr(Vm *vm) {
    primary(vm);

    if (vm->compiler.previous.type == TOKEN_CLOSE_BRACE) {
        return;
    }

    open_scope(vm);
    while (!check(vm, TOKEN_CLOSE_BRACE) && !check(vm, TOKEN_EOF)) {
        stmt(vm);
    }

    // block expression needs a return value
    if (last_instruction(vm) == OP_POP) {
        remove_arg(vm);
    }

    close_scope(vm);
    advance(vm);
}